

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  char *pcVar1;
  string filename;
  string projectName;
  string outputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_30,pcVar1,(allocator *)&local_70);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_70,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  std::operator+(&local_90,&local_30,"/");
  std::operator+(&local_50,&local_70,".project");
  std::__cxx11::string::append((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  CreateNewProjectFile(this,lgs,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();
  std::string filename = outputDir + "/";

  filename += projectName + ".project";
  this->CreateNewProjectFile(lgs, filename);
}